

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall
std::
_Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<unsigned_char>_>
::_Tuple_impl(_Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<unsigned_char>_>
              *this,_Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<unsigned_char>_>
                    *param_2)

{
  VTable *pVVar1;
  SharedPayloadBase *pSVar2;
  VTable *pVVar3;
  
  (this->super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>).
  super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
  super_MatcherBase<unsigned_char>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032ab98;
  pVVar1 = (param_2->super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>).
           super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
           super_MatcherBase<unsigned_char>.vtable_;
  (this->super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>).
  super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
  super_MatcherBase<unsigned_char>.vtable_ = pVVar1;
  (this->super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>).
  super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
  super_MatcherBase<unsigned_char>.buffer_ =
       (param_2->super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>).
       super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
       super_MatcherBase<unsigned_char>.buffer_;
  if ((pVVar1 != (VTable *)0x0) &&
     (pVVar1->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    pSVar2 = (this->super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>).
             super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
             super_MatcherBase<unsigned_char>.buffer_.shared;
    LOCK();
    (pSVar2->ref).super___atomic_base<int>._M_i = (pSVar2->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>).
  super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
  super_MatcherBase<unsigned_char>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032ac38;
  (this->
  super__Head_base<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_false>
  )._M_head_impl.
  super_MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032ab40;
  pVVar3 = (param_2->
           super__Head_base<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_false>
           )._M_head_impl.
           super_MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>
           .vtable_;
  (this->
  super__Head_base<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_false>
  )._M_head_impl.
  super_MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>.
  vtable_ = pVVar3;
  (this->
  super__Head_base<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_false>
  )._M_head_impl.
  super_MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>.
  buffer_ = (param_2->
            super__Head_base<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_false>
            )._M_head_impl.
            super_MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>
            .buffer_;
  if ((pVVar3 != (VTable *)0x0) &&
     (pVVar3->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    pSVar2 = (this->
             super__Head_base<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_false>
             )._M_head_impl.
             super_MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>
             .buffer_.shared;
    LOCK();
    (pSVar2->ref).super___atomic_base<int>._M_i = (pSVar2->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->
  super__Head_base<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_false>
  )._M_head_impl.
  super_MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032abf0;
  return;
}

Assistant:

MatcherBase(const MatcherBase& other)
      : vtable_(other.vtable_), buffer_(other.buffer_) {
    if (IsShared()) buffer_.shared->Ref();
  }